

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O3

void __thiscall
spirv_cross::CompilerGLSL::emit_block_instructions(CompilerGLSL *this,SPIRBlock *block)

{
  uint32_t uVar1;
  iterator iVar2;
  TemporaryCopy TVar3;
  size_t sVar4;
  long lVar5;
  Instruction *op;
  Instruction *instruction;
  key_type local_98 [4];
  SmallVector<unsigned_int,_8UL> local_88;
  SPIRBlock *local_50;
  long local_48;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_40;
  Phi *local_38;
  
  this->current_emitting_block = block;
  local_50 = block;
  if (((this->backend).requires_relaxed_precision_analysis == true) &&
     (sVar4 = (block->phi_variables).super_VectorView<spirv_cross::SPIRBlock::Phi>.buffer_size,
     sVar4 != 0)) {
    local_38 = (block->phi_variables).super_VectorView<spirv_cross::SPIRBlock::Phi>.ptr;
    local_40 = &(this->temporary_to_mirror_precision_alias)._M_h;
    local_48 = sVar4 * 0xc;
    lVar5 = 0;
    do {
      local_98[0] = *(undefined4 *)((long)&(local_38->function_variable).id + lVar5);
      iVar2 = ::std::
              _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(local_40,local_98);
      if (iVar2.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>._M_cur
          != (__node_type *)0x0) {
        local_88.super_VectorView<unsigned_int>.buffer_size = 0;
        local_88.buffer_capacity = 8;
        local_98[0] = 0x53;
        local_98[1] = 0;
        local_98[2] = 3;
        local_88.super_VectorView<unsigned_int>.ptr = (uint *)&local_88.stack_storage;
        uVar1 = Compiler::expression_type_id
                          (&this->super_Compiler,
                           *(uint32_t *)
                            ((long)iVar2.
                                   super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                                   ._M_cur + 8));
        SmallVector<unsigned_int,_8UL>::reserve
                  (&local_88,local_88.super_VectorView<unsigned_int>.buffer_size + 1);
        *(uint32_t *)
         ((char *)local_88.super_VectorView<unsigned_int>.ptr +
         local_88.super_VectorView<unsigned_int>.buffer_size * 4) = uVar1;
        sVar4 = local_88.super_VectorView<unsigned_int>.buffer_size + 2;
        local_88.super_VectorView<unsigned_int>.buffer_size =
             local_88.super_VectorView<unsigned_int>.buffer_size + 1;
        SmallVector<unsigned_int,_8UL>::reserve(&local_88,sVar4);
        *(undefined4 *)
         ((char *)local_88.super_VectorView<unsigned_int>.ptr +
         local_88.super_VectorView<unsigned_int>.buffer_size * 4) =
             *(undefined4 *)
              ((long)iVar2.
                     super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>.
                     _M_cur + 0xc);
        sVar4 = local_88.super_VectorView<unsigned_int>.buffer_size + 2;
        local_88.super_VectorView<unsigned_int>.buffer_size =
             local_88.super_VectorView<unsigned_int>.buffer_size + 1;
        SmallVector<unsigned_int,_8UL>::reserve(&local_88,sVar4);
        *(undefined4 *)
         ((char *)local_88.super_VectorView<unsigned_int>.ptr +
         local_88.super_VectorView<unsigned_int>.buffer_size * 4) =
             *(undefined4 *)
              ((long)iVar2.
                     super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>.
                     _M_cur + 8);
        local_88.super_VectorView<unsigned_int>.buffer_size =
             local_88.super_VectorView<unsigned_int>.buffer_size + 1;
        (*(this->super_Compiler)._vptr_Compiler[8])(this,local_98);
        local_88.super_VectorView<unsigned_int>.buffer_size = 0;
        if ((AlignedBuffer<unsigned_int,_8UL> *)local_88.super_VectorView<unsigned_int>.ptr !=
            &local_88.stack_storage) {
          free(local_88.super_VectorView<unsigned_int>.ptr);
        }
      }
      lVar5 = lVar5 + 0xc;
    } while (local_48 != lVar5);
  }
  sVar4 = (local_50->ops).super_VectorView<spirv_cross::Instruction>.buffer_size;
  if (sVar4 != 0) {
    instruction = (local_50->ops).super_VectorView<spirv_cross::Instruction>.ptr;
    lVar5 = sVar4 * 0xc;
    do {
      TVar3 = handle_instruction_precision(this,instruction);
      (*(this->super_Compiler)._vptr_Compiler[8])(this,instruction);
      if (TVar3.dst_id != 0) {
        local_88.super_VectorView<unsigned_int>.buffer_size = 0;
        local_88.buffer_capacity = 8;
        local_98[0] = 0x53;
        local_98[1] = 0;
        local_98[2] = 3;
        local_88.super_VectorView<unsigned_int>.ptr = (uint *)&local_88.stack_storage;
        uVar1 = Compiler::expression_type_id(&this->super_Compiler,TVar3.src_id);
        SmallVector<unsigned_int,_8UL>::reserve
                  (&local_88,local_88.super_VectorView<unsigned_int>.buffer_size + 1);
        *(uint32_t *)
         ((char *)local_88.super_VectorView<unsigned_int>.ptr +
         local_88.super_VectorView<unsigned_int>.buffer_size * 4) = uVar1;
        sVar4 = local_88.super_VectorView<unsigned_int>.buffer_size + 2;
        local_88.super_VectorView<unsigned_int>.buffer_size =
             local_88.super_VectorView<unsigned_int>.buffer_size + 1;
        SmallVector<unsigned_int,_8UL>::reserve(&local_88,sVar4);
        *(uint32_t *)
         ((char *)local_88.super_VectorView<unsigned_int>.ptr +
         local_88.super_VectorView<unsigned_int>.buffer_size * 4) = TVar3.dst_id;
        sVar4 = local_88.super_VectorView<unsigned_int>.buffer_size + 2;
        local_88.super_VectorView<unsigned_int>.buffer_size =
             local_88.super_VectorView<unsigned_int>.buffer_size + 1;
        SmallVector<unsigned_int,_8UL>::reserve(&local_88,sVar4);
        *(uint32_t *)
         ((char *)local_88.super_VectorView<unsigned_int>.ptr +
         local_88.super_VectorView<unsigned_int>.buffer_size * 4) = TVar3.src_id;
        local_88.super_VectorView<unsigned_int>.buffer_size =
             local_88.super_VectorView<unsigned_int>.buffer_size + 1;
        this->block_temporary_hoisting = true;
        (*(this->super_Compiler)._vptr_Compiler[8])(this,local_98);
        this->block_temporary_hoisting = false;
        local_88.super_VectorView<unsigned_int>.buffer_size = 0;
        if ((AlignedBuffer<unsigned_int,_8UL> *)local_88.super_VectorView<unsigned_int>.ptr !=
            &local_88.stack_storage) {
          free(local_88.super_VectorView<unsigned_int>.ptr);
        }
      }
      instruction = instruction + 1;
      lVar5 = lVar5 + -0xc;
    } while (lVar5 != 0);
  }
  this->current_emitting_block = (SPIRBlock *)0x0;
  return;
}

Assistant:

void CompilerGLSL::emit_block_instructions(SPIRBlock &block)
{
	current_emitting_block = &block;

	if (backend.requires_relaxed_precision_analysis)
	{
		// If PHI variables are consumed in unexpected precision contexts, copy them here.
		for (auto &phi : block.phi_variables)
		{
			auto itr = temporary_to_mirror_precision_alias.find(phi.function_variable);
			if (itr != temporary_to_mirror_precision_alias.end())
			{
				// Explicitly, we don't want to inherit RelaxedPrecision state in this CopyObject,
				// so it helps to have handle_instruction_precision() on the outside of emit_instruction().
				EmbeddedInstruction inst;
				inst.op = OpCopyObject;
				inst.length = 3;
				inst.ops.push_back(expression_type_id(itr->first));
				inst.ops.push_back(itr->second);
				inst.ops.push_back(itr->first);
				emit_instruction(inst);
			}
		}
	}

	for (auto &op : block.ops)
	{
		auto temporary_copy = handle_instruction_precision(op);
		emit_instruction(op);
		if (temporary_copy.dst_id)
		{
			// Explicitly, we don't want to inherit RelaxedPrecision state in this CopyObject,
			// so it helps to have handle_instruction_precision() on the outside of emit_instruction().
			EmbeddedInstruction inst;
			inst.op = OpCopyObject;
			inst.length = 3;
			inst.ops.push_back(expression_type_id(temporary_copy.src_id));
			inst.ops.push_back(temporary_copy.dst_id);
			inst.ops.push_back(temporary_copy.src_id);

			// Never attempt to hoist mirrored temporaries.
			// They are hoisted in lock-step with their parents.
			block_temporary_hoisting = true;
			emit_instruction(inst);
			block_temporary_hoisting = false;
		}
	}

	current_emitting_block = nullptr;
}